

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

int __thiscall ImDrawList::_CalcCircleAutoSegmentCount(ImDrawList *this,float radius)

{
  int iVar1;
  long in_RDI;
  float in_XMM0_Da;
  float fVar2;
  int radius_idx;
  undefined4 local_4;
  
  iVar1 = (int)(in_XMM0_Da + 0.999999);
  if ((iVar1 < 0) || (0x3f < iVar1)) {
    fVar2 = ImMin<float>(*(float *)(*(long *)(in_RDI + 0x38) + 0x1c),in_XMM0_Da);
    fVar2 = acosf(1.0 - fVar2 / in_XMM0_Da);
    fVar2 = ceilf(3.1415927 / fVar2);
    local_4 = ImClamp<int>(((int)fVar2 + 1) / 2 << 1,4,0x200);
  }
  else {
    local_4 = (uint)*(byte *)(*(long *)(in_RDI + 0x38) + 0x1cc + (long)iVar1);
  }
  return local_4;
}

Assistant:

int ImDrawList::_CalcCircleAutoSegmentCount(float radius) const
{
    // Automatic segment count
    const int radius_idx = (int)(radius + 0.999999f); // ceil to never reduce accuracy
    if (radius_idx >= 0 && radius_idx < IM_ARRAYSIZE(_Data->CircleSegmentCounts))
        return _Data->CircleSegmentCounts[radius_idx]; // Use cached value
    else
        return IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, _Data->CircleSegmentMaxError);
}